

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

void xmlTextWriterStartDocumentCallback(void *ctx)

{
  htmlDocPtr pxVar1;
  htmlDocPtr pxVar2;
  xmlChar *pxVar3;
  
  pxVar2 = *(htmlDocPtr *)((long)ctx + 0x10);
  if (*(int *)((long)ctx + 0x34) == 0) {
    if (pxVar2 == (htmlDocPtr)0x0) {
      pxVar2 = xmlNewDoc(*(xmlChar **)((long)ctx + 0x20));
      *(htmlDocPtr *)((long)ctx + 0x10) = pxVar2;
      if (pxVar2 == (xmlDocPtr)0x0) goto LAB_001b5add;
    }
    if (pxVar2->children == (_xmlNode *)0x0) {
      if (*(xmlChar **)((long)ctx + 0x28) == (xmlChar *)0x0) {
        pxVar2->encoding = (xmlChar *)0x0;
        pxVar2->standalone = *(int *)((long)ctx + 0x30);
      }
      else {
        pxVar3 = xmlStrdup(*(xmlChar **)((long)ctx + 0x28));
        pxVar1 = *(htmlDocPtr *)((long)ctx + 0x10);
        pxVar2->encoding = pxVar3;
        pxVar2->standalone = *(int *)((long)ctx + 0x30);
        pxVar2 = pxVar1;
        if (pxVar1 == (htmlDocPtr)0x0) {
          return;
        }
      }
    }
  }
  else if (pxVar2 == (htmlDocPtr)0x0) {
    pxVar2 = htmlNewDocNoDtD((xmlChar *)0x0,(xmlChar *)0x0);
    *(htmlDocPtr *)((long)ctx + 0x10) = pxVar2;
    if (pxVar2 == (htmlDocPtr)0x0) {
LAB_001b5add:
      xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
      return;
    }
  }
  if (((pxVar2->URL == (xmlChar *)0x0) && (*(long *)((long)ctx + 0x38) != 0)) &&
     (pxVar3 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 8), pxVar3 != (xmlChar *)0x0)) {
    pxVar3 = xmlCanonicPath(pxVar3);
    *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x88) = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) {
      pxVar3 = xmlStrdup(*(xmlChar **)(*(long *)((long)ctx + 0x38) + 8));
      *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x88) = pxVar3;
    }
  }
  return;
}

Assistant:

static void
xmlTextWriterStartDocumentCallback(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlDocPtr doc;

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html) {
        if (ctxt->myDoc == NULL)
            ctxt->myDoc = htmlNewDocNoDtD(NULL, NULL);
        if (ctxt->myDoc == NULL) {
            xmlCtxtErrMemory(ctxt);
            return;
        }
    } else
#endif
    {
        doc = ctxt->myDoc;
        if (doc == NULL)
            doc = ctxt->myDoc = xmlNewDoc(ctxt->version);
        if (doc != NULL) {
            if (doc->children == NULL) {
                if (ctxt->encoding != NULL)
                    doc->encoding = xmlStrdup(ctxt->encoding);
                else
                    doc->encoding = NULL;
                doc->standalone = ctxt->standalone;
            }
        } else {
            xmlCtxtErrMemory(ctxt);
            return;
        }
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->URL == NULL) &&
        (ctxt->input != NULL) && (ctxt->input->filename != NULL)) {
        ctxt->myDoc->URL =
            xmlCanonicPath((const xmlChar *) ctxt->input->filename);
        if (ctxt->myDoc->URL == NULL)
            ctxt->myDoc->URL =
                xmlStrdup((const xmlChar *) ctxt->input->filename);
    }
}